

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>,_run_for_at_least_argument_t<steady_clock,_repeater<now<steady_clock>_>_>_>
 Catch::Benchmark::Detail::
 run_for_at_least<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>>>
           (ClockDuration<std::chrono::_V2::steady_clock> how_long,int seed,
           repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_> *fun)

{
  ulong uVar1;
  TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>_&,_int_&>
  TVar2;
  TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>,_run_for_at_least_argument_t<steady_clock,_repeater<now<steady_clock>_>_>_>
  TVar3;
  uint local_2c;
  optimized_away_error local_28;
  
  do {
    if (0x3fffffff < seed) {
      local_28 = (optimized_away_error)&PTR__exception_001d76e8;
      throw_exception<Catch::Benchmark::Detail::optimized_away_error>(&local_28);
    }
    uVar1 = (ulong)(uint)seed;
    local_2c = seed;
    TVar2 = measure<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>>&,int&>
                      (fun,(int *)&local_2c);
    TVar3.elapsed = TVar2.elapsed.__r;
    seed = seed * 2;
  } while (TVar3.elapsed.__r < how_long.__r);
  TVar3._8_8_ = uVar1 << 0x20;
  return TVar3;
}

Assistant:

TimingOf<Clock, Fun, run_for_at_least_argument_t<Clock, Fun>> run_for_at_least(ClockDuration<Clock> how_long, int seed, Fun&& fun) {
                auto iters = seed;
                while (iters < (1 << 30)) {
                    auto&& Timing = measure_one<Clock>(fun, iters, is_callable<Fun(Chronometer)>());

                    if (Timing.elapsed >= how_long) {
                        return { Timing.elapsed, std::move(Timing.result), iters };
                    }
                    iters *= 2;
                }
                Catch::throw_exception(optimized_away_error{});
            }